

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.c
# Opt level: O2

Bool prvTidyWarnMissingSIInEmittedDocType(TidyDocImpl *doc)

{
  uint vers;
  ctmbstr ptVar1;
  Node *node;
  AttVal *pAVar2;
  Bool BVar3;
  Bool BVar4;
  Bool in_ESI;
  
  BVar3 = no;
  BVar4 = no;
  if (doc->lexer->isvoyager == no) {
    vers = doc->lexer->versionEmitted;
    ptVar1 = prvTidyHTMLVersionNameFromCode(vers,in_ESI);
    if (ptVar1 != (ctmbstr)0x0) {
      ptVar1 = GetSIFromVers(vers);
      BVar4 = BVar3;
      if (ptVar1 != (ctmbstr)0x0) {
        node = prvTidyFindDocType(doc);
        if (node != (Node *)0x0) {
          pAVar2 = prvTidyGetAttrByName(node,"SYSTEM");
          if (pAVar2 == (AttVal *)0x0) {
            BVar4 = yes;
          }
        }
      }
    }
  }
  return BVar4;
}

Assistant:

Bool TY_(WarnMissingSIInEmittedDocType)( TidyDocImpl* doc )
{
    Bool isXhtml = doc->lexer->isvoyager;
    Node* doctype;
    
    /* Do not warn in XHTML mode */
    if ( isXhtml )
        return no;

    /* Do not warn if emitted doctype is proprietary */
    if ( TY_(HTMLVersionNameFromCode)(doc->lexer->versionEmitted, isXhtml ) == NULL )
        return no;

    /* Do not warn if no SI is possible */
    if ( GetSIFromVers(doc->lexer->versionEmitted) == NULL )
        return no;

    if ( (doctype = TY_(FindDocType)( doc )) != NULL
         && TY_(GetAttrByName)(doctype, "SYSTEM") == NULL )
        return yes;

    return no;
}